

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

void __thiscall FMB::FiniteModelMultiSorted::initTables(FiniteModelMultiSorted *this)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  OperatorType *pOVar5;
  TermList TVar6;
  long lVar7;
  InvalidOperationException *this_00;
  uint i;
  uint uVar8;
  uint i_2;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  Lib::DArray<unsigned_int>::ensure
            (&this->_f_offsets,
             (ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3 &
             0xffffffff);
  Lib::DArray<unsigned_int>::ensure
            (&this->_p_offsets,
             (ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3 &
             0xffffffff);
  uVar12 = 0;
  uVar9 = 0;
  do {
    lVar7 = *(long *)(DAT_00a14190 + 0x60);
    if ((uint)((ulong)(*(long *)(DAT_00a14190 + 0x68) - lVar7) >> 3) <= uVar12) {
      uVar12 = 0;
      Lib::DArray<unsigned_int>::expand(&this->_f_interpretation,(ulong)uVar9,0);
      uVar11 = 1;
      while( true ) {
        lVar7 = *(long *)(DAT_00a14190 + 0x80);
        uVar9 = (uint)uVar11;
        if ((uint)((ulong)(*(long *)(DAT_00a14190 + 0x88) - lVar7) >> 3) <= uVar9) {
          Lib::DArray<char>::expand(&this->_p_interpretation,(ulong)uVar12,'\0');
          Lib::DArray<Lib::DArray<int>_>::ensure
                    (&this->sortRepr,
                     (ulong)(*(long *)(DAT_00a14190 + 0xa8) - *(long *)(DAT_00a14190 + 0xa0)) >> 3 &
                     0xffffffff);
          lVar7 = DAT_00a14190;
          for (uVar11 = 0;
              uVar11 < ((ulong)(*(long *)(lVar7 + 0xa8) - *(long *)(lVar7 + 0xa0)) >> 3 & 0xffffffff
                       ); uVar11 = uVar11 + 1) {
            if (3 < (int)uVar11 - 1U) {
              Lib::DArray<int>::ensure
                        ((this->sortRepr)._array + uVar11,(ulong)((this->_sizes)._array[uVar11] + 1)
                        );
              lVar7 = DAT_00a14190;
              puVar2 = (this->_sizes)._array;
              piVar3 = (this->sortRepr)._array[uVar11]._array;
              for (uVar9 = 0; uVar9 <= puVar2[uVar11]; uVar9 = uVar9 + 1) {
                piVar3[uVar9] = -1;
              }
            }
          }
          return;
        }
        uVar1 = *(uint *)(*(long *)(lVar7 + (long)(int)uVar9 * 8) + 0x20);
        (this->_p_offsets)._array[uVar11] = uVar12;
        pOVar5 = Kernel::Signature::Symbol::predType(*(Symbol **)(lVar7 + uVar11 * 8));
        uVar8 = 1;
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          TVar6 = Kernel::OperatorType::arg(pOVar5,uVar10);
          uVar4 = (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
          if ((int)uVar4 < 2) {
            uVar4 = 1;
          }
          uVar8 = uVar8 * uVar4;
        }
        if (~uVar8 <= uVar12) break;
        uVar12 = uVar12 + uVar8;
        uVar11 = (ulong)(uVar9 + 1);
      }
      this_00 = (InvalidOperationException *)__cxa_allocate_exception(0x28);
      Lib::InvalidOperationException::InvalidOperationException
                (this_00,"Model too large to represent!");
LAB_0025dff1:
      __cxa_throw(this_00,&Lib::InvalidOperationException::typeinfo,Lib::Exception::~Exception);
    }
    uVar1 = *(uint *)(*(long *)(lVar7 + (long)(int)uVar12 * 8) + 0x20);
    (this->_f_offsets)._array[uVar12] = uVar9;
    pOVar5 = Kernel::Signature::Symbol::fnType(*(Symbol **)(lVar7 + (ulong)uVar12 * 8));
    uVar10 = 1;
    for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
      TVar6 = Kernel::OperatorType::arg(pOVar5,uVar8);
      uVar10 = uVar10 * (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
    }
    if (~uVar10 <= uVar9) {
      this_00 = (InvalidOperationException *)__cxa_allocate_exception(0x28);
      Lib::InvalidOperationException::InvalidOperationException
                (this_00,"Model too large to represent!");
      goto LAB_0025dff1;
    }
    uVar9 = uVar9 + uVar10;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void FiniteModelMultiSorted::initTables()
{
  _f_offsets.ensure(env.signature->functions());
  _p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=0;
  for(unsigned f=0; f<env.signature->functions();f++){
    unsigned arity=env.signature->functionArity(f);
    _f_offsets[f]=offsets;

    OperatorType* sig = env.signature->getFunction(f)->fnType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      add *= _sizes[sig->arg(i).term()->functor()];
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _f_interpretation.expand(offsets,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=0;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    _p_offsets[p]=offsets;

    OperatorType* sig = env.signature->getPredicate(p)->predType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      int mult = _sizes[sig->arg(i).term()->functor()];
      ASS(mult>0);
      add *= (mult>0 ? mult : 1);
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _p_interpretation.expand(offsets,0);

  sortRepr.ensure(env.signature->typeCons());
  for(unsigned s=0;s<env.signature->typeCons();s++){
    if(env.signature->isInterpretedNonDefault(s))
      continue;
    sortRepr[s].ensure(_sizes[s]+1);
    for(unsigned i=0;i<=_sizes[s];i++){
      sortRepr[s][i] = -1;
    }
  }
}